

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_im2col(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  void *pvVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  int64_t iVar26;
  long lVar27;
  long lVar28;
  undefined2 uVar29;
  long lVar30;
  long lVar31;
  int64_t iih_1;
  long lVar32;
  long lVar33;
  void *pvVar34;
  int64_t iih;
  long lVar35;
  long lVar36;
  bool bVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  long local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  void *local_120;
  long local_110;
  void *local_108;
  void *local_e0;
  long local_d8;
  void *local_c0;
  long local_b8;
  long local_a8;
  void *local_a0;
  
  if (dst->type == GGML_TYPE_F32) {
    pgVar7 = dst->src[1];
    if (pgVar7->type == GGML_TYPE_F32) {
      lVar16 = pgVar7->ne[1];
      iVar20 = (int)pgVar7->nb[2];
      bVar37 = dst->op_params[6] != 1;
      lVar14 = pgVar7->ne[2];
      lVar12 = pgVar7->ne[3];
      if (bVar37) {
        lVar14 = lVar16;
        lVar12 = pgVar7->ne[2];
      }
      if (bVar37) {
        lVar16 = 1;
      }
      iVar26 = dst->src[0]->ne[1];
      if (bVar37) {
        iVar26 = 1;
      }
      lVar15 = 1;
      if (!bVar37) {
        lVar15 = dst->ne[2];
      }
      iVar13 = (int)pgVar7->nb[3];
      if (bVar37) {
        iVar13 = iVar20;
      }
      if (bVar37) {
        iVar20 = (int)pgVar7->nb[1];
      }
      if (pgVar7->nb[0] == 4) {
        if (0 < lVar12) {
          lVar9 = dst->src[0]->ne[0];
          lVar10 = pgVar7->ne[0];
          lVar11 = dst->ne[1];
          iVar1 = dst->op_params[0];
          iVar2 = dst->op_params[2];
          iVar3 = dst->op_params[3];
          lVar33 = (long)params->ith;
          lVar24 = iVar26 * lVar9;
          local_a0 = (void *)((long)dst->data + lVar24 * lVar33 * 4);
          local_108 = (void *)(lVar33 * iVar20 + lVar10 * iVar3 * -4 + (long)iVar2 * -4);
          iVar4 = dst->op_params[1];
          iVar5 = dst->op_params[4];
          iVar6 = dst->op_params[5];
          lVar31 = (long)params->nth;
          lVar35 = lVar24 * lVar14 * lVar11;
          lVar30 = 0;
          do {
            if (0 < lVar15) {
              local_110 = (long)local_108;
              local_130 = local_a0;
              local_138 = (void *)0x0;
              do {
                if (0 < lVar11) {
                  local_d8 = local_110;
                  local_128 = local_130;
                  lVar23 = 0;
                  lVar28 = -(long)iVar2;
                  do {
                    if (lVar33 < lVar14) {
                      local_b8 = (long)pgVar7->data + local_d8;
                      local_120 = local_128;
                      lVar22 = lVar33;
                      do {
                        if (0 < iVar26) {
                          lVar19 = 0;
                          pvVar18 = local_120;
                          lVar27 = local_b8;
                          do {
                            if (0 < lVar9) {
                              lVar32 = lVar19 * iVar6 +
                                       ((long)local_138 * (long)iVar4 - (long)iVar3);
                              lVar21 = 0;
                              lVar36 = 0;
                              do {
                                uVar38 = 0;
                                if ((((-1 < lVar32) && (lVar32 < lVar16)) && (-1 < lVar28 + lVar21))
                                   && (lVar28 + lVar21 < lVar10)) {
                                  uVar38 = *(undefined4 *)(lVar27 + lVar21 * 4);
                                }
                                *(undefined4 *)((long)pvVar18 + lVar36 * 4) = uVar38;
                                lVar36 = lVar36 + 1;
                                lVar21 = lVar21 + iVar5;
                              } while (lVar9 != lVar36);
                            }
                            lVar19 = lVar19 + 1;
                            pvVar18 = (void *)((long)pvVar18 + lVar9 * 4);
                            lVar27 = lVar27 + lVar10 * iVar6 * 4;
                          } while (lVar19 != iVar26);
                        }
                        lVar22 = lVar22 + lVar31;
                        local_120 = (void *)((long)local_120 + lVar24 * lVar31 * 4);
                        local_b8 = local_b8 + iVar20 * lVar31;
                      } while (lVar22 < lVar14);
                    }
                    lVar23 = lVar23 + 1;
                    local_128 = (void *)((long)local_128 + lVar24 * lVar14 * 4);
                    local_d8 = local_d8 + (long)iVar1 * 4;
                    lVar28 = lVar28 + iVar1;
                  } while (lVar23 != lVar11);
                }
                local_138 = (void *)((long)local_138 + 1);
                local_130 = (void *)((long)local_130 + lVar35 * 4);
                local_110 = local_110 + lVar10 * iVar4 * 4;
              } while (local_138 != (void *)lVar15);
            }
            lVar30 = lVar30 + 1;
            local_a0 = (void *)((long)local_a0 + lVar35 * lVar15 * 4);
            local_108 = (void *)((long)local_108 + (long)iVar13);
          } while (lVar30 != lVar12);
        }
        return;
      }
      pcVar17 = "nb10 == sizeof(float)";
      uVar25 = 0x1671;
    }
    else {
      pcVar17 = "src1->type == GGML_TYPE_F32";
      uVar25 = 0x1653;
    }
  }
  else {
    if (dst->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x16ef,"fatal error");
    }
    pgVar7 = dst->src[0];
    if (pgVar7->type == GGML_TYPE_F16) {
      pgVar8 = dst->src[1];
      if (pgVar8->type == GGML_TYPE_F32) {
        lVar16 = pgVar8->ne[1];
        iVar20 = (int)pgVar8->nb[2];
        bVar37 = dst->op_params[6] != 1;
        lVar14 = pgVar8->ne[2];
        lVar12 = pgVar8->ne[3];
        if (bVar37) {
          lVar14 = lVar16;
          lVar12 = pgVar8->ne[2];
        }
        if (bVar37) {
          lVar16 = 1;
        }
        iVar26 = pgVar7->ne[1];
        if (bVar37) {
          iVar26 = 1;
        }
        lVar15 = 1;
        if (!bVar37) {
          lVar15 = dst->ne[2];
        }
        iVar13 = (int)pgVar8->nb[3];
        if (bVar37) {
          iVar13 = iVar20;
        }
        if (bVar37) {
          iVar20 = (int)pgVar8->nb[1];
        }
        if (pgVar7->nb[0] == 2) {
          if (pgVar8->nb[0] == 4) {
            if (lVar12 < 1) {
              return;
            }
            lVar9 = pgVar7->ne[0];
            lVar10 = pgVar8->ne[0];
            lVar11 = dst->ne[1];
            iVar1 = dst->op_params[2];
            iVar2 = dst->op_params[3];
            lVar30 = (long)params->ith;
            lVar35 = iVar26 * lVar9;
            local_108 = (void *)((long)dst->data + lVar35 * lVar30 * 2);
            iVar3 = dst->op_params[0];
            local_a8 = lVar30 * iVar20 + lVar10 * iVar2 * -4 + (long)iVar1 * -4;
            iVar4 = dst->op_params[1];
            iVar5 = dst->op_params[4];
            iVar6 = dst->op_params[5];
            lVar31 = (long)params->nth;
            lVar33 = lVar35 * lVar14 * lVar11;
            lVar24 = 0;
            do {
              if (0 < lVar15) {
                local_130 = (void *)local_a8;
                local_138 = local_108;
                local_140 = 0;
                do {
                  if (0 < lVar11) {
                    local_128 = local_130;
                    local_e0 = local_138;
                    lVar23 = 0;
                    lVar28 = -(long)iVar1;
                    do {
                      if (lVar30 < lVar14) {
                        local_120 = (void *)((long)pgVar8->data + (long)local_128);
                        local_c0 = local_e0;
                        lVar22 = lVar30;
                        do {
                          if (0 < iVar26) {
                            lVar27 = 0;
                            pvVar18 = local_c0;
                            pvVar34 = local_120;
                            do {
                              if (0 < lVar9) {
                                lVar36 = lVar27 * iVar6 + (local_140 * iVar4 - (long)iVar2);
                                lVar21 = 0;
                                lVar19 = 0;
                                do {
                                  uVar29 = 0;
                                  if (((-1 < lVar36) && (lVar36 < lVar16)) &&
                                     ((-1 < lVar28 + lVar21 &&
                                      (uVar29 = 0, lVar28 + lVar21 < lVar10)))) {
                                    auVar39 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar34 +
                                                                              lVar21 * 4)),0);
                                    uVar29 = auVar39._0_2_;
                                  }
                                  *(undefined2 *)((long)pvVar18 + lVar19 * 2) = uVar29;
                                  lVar19 = lVar19 + 1;
                                  lVar21 = lVar21 + iVar5;
                                } while (lVar9 != lVar19);
                              }
                              lVar27 = lVar27 + 1;
                              pvVar18 = (void *)((long)pvVar18 + lVar9 * 2);
                              pvVar34 = (void *)((long)pvVar34 + lVar10 * iVar6 * 4);
                            } while (lVar27 != iVar26);
                          }
                          lVar22 = lVar22 + lVar31;
                          local_c0 = (void *)((long)local_c0 + lVar35 * lVar31 * 2);
                          local_120 = (void *)((long)local_120 + iVar20 * lVar31);
                        } while (lVar22 < lVar14);
                      }
                      lVar23 = lVar23 + 1;
                      local_e0 = (void *)((long)local_e0 + lVar35 * lVar14 * 2);
                      local_128 = (void *)((long)local_128 + (long)iVar3 * 4);
                      lVar28 = lVar28 + iVar3;
                    } while (lVar23 != lVar11);
                  }
                  local_140 = local_140 + 1;
                  local_138 = (void *)((long)local_138 + lVar33 * 2);
                  local_130 = (void *)((long)local_130 + lVar10 * iVar4 * 4);
                } while (local_140 != lVar15);
              }
              lVar24 = lVar24 + 1;
              local_108 = (void *)((long)local_108 + lVar33 * lVar15 * 2);
              local_a8 = local_a8 + iVar13;
            } while (lVar24 != lVar12);
            return;
          }
          pcVar17 = "nb10 == sizeof(float)";
          uVar25 = 0x16bf;
        }
        else {
          pcVar17 = "nb00 == sizeof(ggml_fp16_t)";
          uVar25 = 0x16be;
        }
      }
      else {
        pcVar17 = "src1->type == GGML_TYPE_F32";
        uVar25 = 0x16a0;
      }
    }
    else {
      pcVar17 = "src0->type == GGML_TYPE_F16";
      uVar25 = 0x169f;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar17);
}

Assistant:

void ggml_compute_forward_im2col(
        const ggml_compute_params * params,
              ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_im2col_f16(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_im2col_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}